

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

IVal * __thiscall
deqp::gls::BuiltinPrecisionTests::
Apply<deqp::gls::BuiltinPrecisionTests::Signature<float,_tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
::doEvaluate(IVal *__return_storage_ptr__,
            Apply<deqp::gls::BuiltinPrecisionTests::Signature<float,_tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
            *this,EvalContext *ctx)

{
  Func<deqp::gls::BuiltinPrecisionTests::Signature<float,_tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *this_00;
  Expr<tcu::Vector<float,_2>_> *this_01;
  Expr<deqp::gls::BuiltinPrecisionTests::Void> *pEVar1;
  IArg3 local_4d [2];
  IArg2 local_4b [2];
  IArg1 local_49;
  IVal local_48;
  EvalContext *local_18;
  EvalContext *ctx_local;
  Apply<deqp::gls::BuiltinPrecisionTests::Signature<float,_tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *this_local;
  
  this_00 = this->m_func;
  local_18 = ctx;
  ctx_local = (EvalContext *)this;
  this_01 = de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>::
            operator->((SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>
                        *)&this->m_args);
  Expr<tcu::Vector<float,_2>_>::evaluate(&local_48,this_01,local_18);
  pEVar1 = de::
           SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<deqp::gls::BuiltinPrecisionTests::Void>_>
           ::operator->((SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<deqp::gls::BuiltinPrecisionTests::Void>_>
                         *)&(this->m_args).b);
  Expr<deqp::gls::BuiltinPrecisionTests::Void>::evaluate(pEVar1,local_18);
  pEVar1 = de::
           SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<deqp::gls::BuiltinPrecisionTests::Void>_>
           ::operator->((SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<deqp::gls::BuiltinPrecisionTests::Void>_>
                         *)&(this->m_args).c);
  Expr<deqp::gls::BuiltinPrecisionTests::Void>::evaluate(pEVar1,local_18);
  pEVar1 = de::
           SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<deqp::gls::BuiltinPrecisionTests::Void>_>
           ::operator->((SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<deqp::gls::BuiltinPrecisionTests::Void>_>
                         *)&(this->m_args).d);
  Expr<deqp::gls::BuiltinPrecisionTests::Void>::evaluate(pEVar1,local_18);
  Func<deqp::gls::BuiltinPrecisionTests::Signature<float,_tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  ::apply(__return_storage_ptr__,this_00,ctx,&local_48,&local_49,local_4b,local_4d);
  return __return_storage_ptr__;
}

Assistant:

IVal				doEvaluate		(const EvalContext& ctx) const
	{
		return m_func.apply(ctx,
							m_args.a->evaluate(ctx), m_args.b->evaluate(ctx),
							m_args.c->evaluate(ctx), m_args.d->evaluate(ctx));
	}